

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# status.cc
# Opt level: O1

string * __thiscall
leveldb::Status::ToString_abi_cxx11_(string *__return_storage_ptr__,Status *this)

{
  char *pcVar1;
  size_t sVar2;
  char *__s;
  char tmp [30];
  char acStack_38 [32];
  
  __s = acStack_38;
  pcVar1 = this->state_;
  if (pcVar1 == (char *)0x0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"OK","");
  }
  else {
    if ((ulong)(byte)pcVar1[4] < 6) {
      __s = &DAT_0013f1c4 + *(int *)(&DAT_0013f1c4 + (ulong)(byte)pcVar1[4] * 4);
    }
    else {
      snprintf(acStack_38,0x1e,"Unknown code(%d): ",(ulong)(uint)(int)pcVar1[4]);
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    sVar2 = strlen(__s);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,__s,__s + sVar2);
    std::__cxx11::string::append((char *)__return_storage_ptr__,(ulong)(this->state_ + 5));
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Status::ToString() const {
  if (state_ == nullptr) {
    return "OK";
  } else {
    char tmp[30];
    const char* type;
    switch (code()) {
      case kOk:
        type = "OK";
        break;
      case kNotFound:
        type = "NotFound: ";
        break;
      case kCorruption:
        type = "Corruption: ";
        break;
      case kNotSupported:
        type = "Not implemented: ";
        break;
      case kInvalidArgument:
        type = "Invalid argument: ";
        break;
      case kIOError:
        type = "IO error: ";
        break;
      default:
        std::snprintf(tmp, sizeof(tmp),
                      "Unknown code(%d): ", static_cast<int>(code()));
        type = tmp;
        break;
    }
    std::string result(type);
    uint32_t length;
    std::memcpy(&length, state_, sizeof(length));
    result.append(state_ + 5, length);
    return result;
  }
}